

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall
CTcPrsOpRel::eval_constant(CTcPrsOpRel *this,CTcPrsNode *left,CTcPrsNode *right)

{
  int iVar1;
  tc_constval_type_t tVar2;
  tc_constval_type_t tVar3;
  tc_toktyp_t op;
  CTcConstVal *this_00;
  CTcConstVal *this_01;
  long lVar4;
  long lVar5;
  char *pcVar6;
  char *__s2;
  vbignum_t *this_02;
  long *in_RDX;
  CTcPrsNode *in_RSI;
  CTcPrsOpBin *in_RDI;
  vbignum_t b_2;
  vbignum_t a_2;
  vbignum_t b_1;
  vbignum_t a_1;
  vbignum_t b;
  vbignum_t a;
  long val2;
  long val1;
  int sense;
  tc_constval_type_t typ2;
  tc_constval_type_t typ1;
  CTcConstVal *c2;
  CTcConstVal *c1;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  vbignum_t *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  vbignum_t *in_stack_ffffffffffffff10;
  uint local_9c;
  uint local_3c;
  CTcPrsNode *local_8;
  undefined4 extraout_var;
  
  iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x2a4fd9);
  if ((iVar1 == 0) || (iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x2a4fef), iVar1 == 0)) {
    local_8 = (CTcPrsNode *)0x0;
  }
  else {
    iVar1 = (*(in_RSI->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
    this_00 = (CTcConstVal *)CONCAT44(extraout_var,iVar1);
    this_01 = (CTcConstVal *)(**(code **)(*in_RDX + 8))();
    tVar2 = CTcConstVal::get_type(this_00);
    tVar3 = CTcConstVal::get_type(this_01);
    if ((tVar2 == TC_CVT_INT) && (tVar3 == TC_CVT_INT)) {
      lVar4 = CTcConstVal::get_val_int(this_00);
      lVar5 = CTcConstVal::get_val_int(this_01);
      if (lVar4 < lVar5) {
        local_9c = 0xffffffff;
      }
      else {
        local_9c = (uint)(lVar4 != lVar5);
      }
      local_3c = local_9c;
    }
    else if ((tVar2 == TC_CVT_SSTR) && (tVar3 == TC_CVT_SSTR)) {
      pcVar6 = CTcConstVal::get_val_str(this_00);
      __s2 = CTcConstVal::get_val_str(this_01);
      local_3c = strcmp(pcVar6,__s2);
    }
    else if ((tVar2 == TC_CVT_FLOAT) && (tVar3 == TC_CVT_FLOAT)) {
      CTcConstVal::get_val_float(this_00);
      CTcConstVal::get_val_float_len(this_00);
      vbignum_t::vbignum_t
                (in_stack_ffffffffffffff10,
                 (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 (size_t)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      CTcConstVal::get_val_float(this_01);
      CTcConstVal::get_val_float_len(this_01);
      vbignum_t::vbignum_t
                (in_stack_ffffffffffffff10,
                 (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 (size_t)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      local_3c = vbignum_t::compare(in_stack_ffffffffffffff00,
                                    (vbignum_t *)
                                    CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      vbignum_t::~vbignum_t(in_stack_ffffffffffffff00);
      vbignum_t::~vbignum_t(in_stack_ffffffffffffff00);
    }
    else if ((tVar2 == TC_CVT_FLOAT) && (tVar3 == TC_CVT_INT)) {
      CTcConstVal::get_val_float(this_00);
      CTcConstVal::get_val_float_len(this_00);
      vbignum_t::vbignum_t
                (in_stack_ffffffffffffff10,
                 (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 (size_t)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      CTcConstVal::get_val_int(this_01);
      vbignum_t::vbignum_t
                (in_stack_ffffffffffffff00,
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      local_3c = vbignum_t::compare(in_stack_ffffffffffffff00,
                                    (vbignum_t *)
                                    CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      vbignum_t::~vbignum_t(in_stack_ffffffffffffff00);
      vbignum_t::~vbignum_t(in_stack_ffffffffffffff00);
    }
    else {
      if ((tVar2 != TC_CVT_INT) || (tVar3 != TC_CVT_FLOAT)) {
        op = CTcPrsOpBin::get_op_tok(in_RDI);
        pcVar6 = CTcTokenizer::get_op_text(op);
        CTcTokenizer::log_error(0x2b06,pcVar6);
        return (CTcPrsNode *)0x0;
      }
      CTcConstVal::get_val_int(this_00);
      vbignum_t::vbignum_t
                (in_stack_ffffffffffffff00,
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      CTcConstVal::get_val_float(this_01);
      this_02 = (vbignum_t *)CTcConstVal::get_val_float_len(this_01);
      vbignum_t::vbignum_t
                (this_02,(char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 (size_t)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      local_3c = vbignum_t::compare(in_stack_ffffffffffffff00,
                                    (vbignum_t *)
                                    CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      vbignum_t::~vbignum_t(in_stack_ffffffffffffff00);
      vbignum_t::~vbignum_t(in_stack_ffffffffffffff00);
    }
    iVar1 = (*(in_RDI->super_CTcPrsOp)._vptr_CTcPrsOp[3])(in_RDI,(ulong)local_3c);
    CTcConstVal::set_bool(this_00,iVar1);
    local_8 = in_RSI;
  }
  return local_8;
}

Assistant:

CTcPrsNode *CTcPrsOpRel::eval_constant(CTcPrsNode *left,
                                       CTcPrsNode *right) const
{
    /* check for constants */
    if (left->is_const() && right->is_const())
    {
        /* get the types */
        CTcConstVal *c1 = left->get_const_val();
        CTcConstVal *c2 = right->get_const_val();
        tc_constval_type_t typ1 = c1->get_type();
        tc_constval_type_t typ2 = c2->get_type();

        /* determine what we're comparing */
        int sense;
        if (typ1 == TC_CVT_INT && typ2 == TC_CVT_INT)
        {
            /* get the values */
            long val1 = c1->get_val_int();
            long val2 = c2->get_val_int();

            /* calculate the sense of the integer comparison */
            sense = (val1 < val2 ? -1 : val1 == val2 ? 0 : 1);
        }
        else if (typ1 == TC_CVT_SSTR && typ2 == TC_CVT_SSTR)
        {
            /* compare the string values */
            sense = strcmp(c1->get_val_str(), c2->get_val_str());
        }
        else if (typ1 == TC_CVT_FLOAT && typ2 == TC_CVT_FLOAT)
        {
            /* both are floats - get as BigNumber values */
            vbignum_t a(c1->get_val_float(), c1->get_val_float_len(), 0);
            vbignum_t b(c2->get_val_float(), c2->get_val_float_len(), 0);
            sense = a.compare(b);
        }
        else if (typ1 == TC_CVT_FLOAT && typ2 == TC_CVT_INT)
        {
            /* float vs int */
            vbignum_t a(c1->get_val_float(), c1->get_val_float_len(), 0);
            vbignum_t b(c2->get_val_int());
            sense = a.compare(b);
        }
        else if (typ1 == TC_CVT_INT && typ2 == TC_CVT_FLOAT)
        {
            vbignum_t a(c1->get_val_int());
            vbignum_t b(c2->get_val_float(), c2->get_val_float_len(), 0);
            sense = a.compare(b);
        }
        else
        {
            /* these types are incomparable */
            G_tok->log_error(TCERR_CONST_BAD_COMPARE,
                             G_tok->get_op_text(get_op_tok()));
            return 0;
        }

        /* set the result in the left value */
        c1->set_bool(get_bool_val(sense));

        /* return the updated left value */
        return left;
    }
    else
    {
        /* 
         *   one or the other is non-constant, so we can't fold the
         *   expression - return null to so indicate 
         */
        return 0;
    }
}